

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CHARACTER::Save
          (_Type_CHARACTER *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Character *pCVar1;
  Variable *this_00;
  Object *pOVar2;
  long *plVar3;
  long in_R8;
  code *local_60;
  Character *C;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  ostream *stream_local;
  _Type_CHARACTER *this_local;
  
  pCVar1 = Object::GetData<LiteScript::Character>(object);
  OStreamer::Write<unsigned_int>(stream,*pCVar1->Index);
  plVar3 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
  local_60 = (code *)caller;
  if ((caller & 1) != 0) {
    local_60 = *(code **)(*plVar3 + (caller - 1));
  }
  this_00 = Nullable<LiteScript::Variable>::operator*(&pCVar1->obj_string);
  pOVar2 = Variable::operator->(this_00);
  (*local_60)(plVar3,stream,pOVar2->ID);
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Character& C = object.GetData<Character>();
    OStreamer::Write<unsigned int>(stream, C.Index);
    (object.memory.*caller)(stream, (*C.obj_string)->ID);
}